

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkLayerValidator.cpp
# Opt level: O0

Result_conflict * __thiscall
CoreML::NeuralNetworkSpecValidator::validateReshapeLayer
          (Result_conflict *__return_storage_ptr__,NeuralNetworkSpecValidator *this,
          NeuralNetworkLayer *layer)

{
  NeuralNetworkLayer *pNVar1;
  bool bVar2;
  int iVar3;
  string *__rhs;
  undefined1 local_1a0 [72];
  string local_158;
  ReshapeLayerParams *params;
  undefined1 local_128 [32];
  Result local_108;
  undefined1 local_d8 [32];
  Result local_b8;
  Result local_88;
  Result local_50;
  NeuralNetworkLayer *local_20;
  NeuralNetworkLayer *layer_local;
  NeuralNetworkSpecValidator *this_local;
  Result_conflict *r;
  
  local_50.m_message._M_storage._M_storage[7] = '\0';
  local_20 = layer;
  layer_local = (NeuralNetworkLayer *)this;
  this_local = (NeuralNetworkSpecValidator *)__return_storage_ptr__;
  Result::Result((Result *)__return_storage_ptr__);
  validateInputCount((Result_conflict *)&local_50,local_20,1,1);
  Result::operator=((Result *)__return_storage_ptr__,&local_50);
  Result::~Result(&local_50);
  bVar2 = Result::good((Result *)__return_storage_ptr__);
  if (bVar2) {
    validateOutputCount((Result_conflict *)&local_88,local_20,1,1);
    Result::operator=((Result *)__return_storage_ptr__,&local_88);
    Result::~Result(&local_88);
  }
  bVar2 = Result::good((Result *)__return_storage_ptr__);
  pNVar1 = local_20;
  if (!bVar2) {
    return __return_storage_ptr__;
  }
  if ((this->ndArrayInterpretation & 1U) != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)local_d8,"Reshape",
               (allocator *)((long)local_108.m_message._M_storage._M_storage + 7));
    validateInputOutputRankEquality
              ((Result_conflict *)(local_d8 + 0x20),pNVar1,(string *)local_d8,&this->blobNameToRank)
    ;
    Result::operator=((Result *)__return_storage_ptr__,(Result *)(local_d8 + 0x20));
    Result::~Result((Result *)(local_d8 + 0x20));
    std::__cxx11::string::~string((string *)local_d8);
    std::allocator<char>::~allocator
              ((allocator<char> *)((long)local_108.m_message._M_storage._M_storage + 7));
    bVar2 = Result::good((Result *)__return_storage_ptr__);
    pNVar1 = local_20;
    if (!bVar2) {
      return __return_storage_ptr__;
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)local_128,"Reshape",(allocator *)((long)&params + 7));
    validateRankCount((Result_conflict *)(local_128 + 0x20),pNVar1,(string *)local_128,5,5,
                      &this->blobNameToRank);
    Result::operator=((Result *)__return_storage_ptr__,(Result *)(local_128 + 0x20));
    Result::~Result((Result *)(local_128 + 0x20));
    std::__cxx11::string::~string((string *)local_128);
    std::allocator<char>::~allocator((allocator<char> *)((long)&params + 7));
    bVar2 = Result::good((Result *)__return_storage_ptr__);
    if (!bVar2) {
      return __return_storage_ptr__;
    }
  }
  local_158._M_storage._M_storage = (uchar  [8])Specification::NeuralNetworkLayer::reshape(local_20)
  ;
  iVar3 = Specification::ReshapeLayerParams::targetshape_size
                    ((ReshapeLayerParams *)local_158._M_storage._M_storage);
  if ((iVar3 != 3) &&
     (iVar3 = Specification::ReshapeLayerParams::targetshape_size
                        ((ReshapeLayerParams *)local_158._M_storage._M_storage), iVar3 != 4)) {
    __rhs = Specification::NeuralNetworkLayer::name_abi_cxx11_(local_20);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_1a0 + 0x28),"Reshape layer \'",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__rhs);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_158,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_1a0 + 0x28),"\' target shape must be 3D or 4D.");
    std::__cxx11::string::~string((string *)(local_1a0 + 0x28));
    Result::Result((Result *)local_1a0,INVALID_MODEL_PARAMETERS,&local_158);
    Result::operator=((Result *)__return_storage_ptr__,(Result *)local_1a0);
    Result::~Result((Result *)local_1a0);
    std::__cxx11::string::~string((string *)&local_158);
  }
  return __return_storage_ptr__;
}

Assistant:

Result NeuralNetworkSpecValidator::validateReshapeLayer(const Specification::NeuralNetworkLayer& layer) {

    Result r;
    r = validateInputCount(layer, 1, 1);
    if (r.good()) {
        r = validateOutputCount(layer, 1, 1);
    }

    if (!r.good()){ return r;}
    if (ndArrayInterpretation) {
        r = validateInputOutputRankEquality(layer, "Reshape", blobNameToRank);
        if (!r.good()) {return r;}
        r = validateRankCount(layer, "Reshape", 5, 5, blobNameToRank);
        if (!r.good()) {return r;}
    }

    const auto& params = layer.reshape();
    if (params.targetshape_size() != 3 && params.targetshape_size() != 4) {
        std::string err = "Reshape layer '" + layer.name() + "' target shape must be 3D or 4D.";
        r = Result(ResultType::INVALID_MODEL_PARAMETERS, err);
    }

    return r;
}